

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::walkFunctionInModule
          (Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_> *this,Function *func,
          Module *module)

{
  Module *module_local;
  Function *func_local;
  Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_> *this_local;
  
  setModule(this,module);
  setFunction(this,func);
  DAEScanner::doWalkFunction((DAEScanner *)(this[-1].stack.fixed._M_elems + 7),func);
  Visitor<wasm::DAEScanner,_void>::visitFunction((Visitor<wasm::DAEScanner,_void> *)this,func);
  setFunction(this,(Function *)0x0);
  setModule(this,(Module *)0x0);
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }